

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::Matcher<const_solitaire::archivers::interfaces::Snapshot_*>::Matcher
          (Matcher<const_solitaire::archivers::interfaces::Snapshot_*> *this,Snapshot *value)

{
  MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*> local_28;
  
  (this->super_MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_003236c8;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<solitaire::archivers::interfaces::Snapshot_const*>::
       GetVTable<testing::internal::MatcherBase<solitaire::archivers::interfaces::Snapshot_const*>::ValuePolicy<testing::internal::EqMatcher<solitaire::archivers::interfaces::Snapshot_const*>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_003236c8;
  local_28.buffer_ = (Buffer)value;
  internal::MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*>::operator=
            (&this->super_MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*>,&local_28)
  ;
  internal::MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*>::~MatcherBase(&local_28)
  ;
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }